

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     sub<false,(InstructionSet::x86::AccessType)2,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (access_t<unsigned_short,_(InstructionSet::x86::AccessType)2> destination,
               read_t<unsigned_short> source,Context *context)

{
  unsigned_short result_00;
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short result;
  Context *context_local;
  read_t<unsigned_short> source_local;
  access_t<unsigned_short,_(InstructionSet::x86::AccessType)2> destination_local;
  
  result_00 = *destination - source;
  bVar1 = Numeric::carried_out<false,15,unsigned_short>(*destination,source,result_00);
  Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,(uint)bVar1);
  bVar1 = Numeric::carried_in<4,unsigned_short>(*destination,source,result_00);
  Flags::set_from<(InstructionSet::x86::Flag)1>(&context->flags,(uint)bVar1);
  uVar2 = Numeric::overflow<false,unsigned_short>(*destination,source,result_00);
  Flags::set_from<(InstructionSet::x86::Flag)3>(&context->flags,(uint)uVar2);
  Flags::
  set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,result_00);
  *destination = result_00;
  return;
}

Assistant:

void sub(
	access_t<IntT, destination_type> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST - (SRC [+ CF]);
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination - source - (with_borrow ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<false, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<false, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	if constexpr (is_writeable(destination_type)) {
		destination = result;
	}
}